

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O2

int __thiscall
MPLSParser::composePip_metadata
          (MPLSParser *this,uint8_t *buffer,int bufferSize,
          vector<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
          *pmtIndexList)

{
  PipCorner PVar1;
  uint uVar2;
  pointer pMVar3;
  pointer pmVar4;
  bool bVar5;
  uint uVar6;
  uint32_t uVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  uint *puVar11;
  long lVar12;
  uint *puVar13;
  uint i;
  uint uVar14;
  MPLSStreamInfo *si;
  pointer __x;
  ulong uVar15;
  uint value;
  float fVar16;
  uint local_b8;
  uint local_b4;
  BitStreamWriter writer;
  vector<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_> pipStreams;
  uint *local_50;
  vector<unsigned_int_*,_std::allocator<unsigned_int_*>_> blockDataAddressPos;
  
  writer.super_BitStream.m_totalBits = 0;
  writer.m_curVal = 0;
  writer.m_bitWrited = 0;
  writer.super_BitStream.m_buffer = (uint *)0x0;
  writer.super_BitStream.m_initBuffer = (uint *)0x0;
  BitStreamWriter::setBuffer(&writer,buffer,buffer + bufferSize);
  local_b8 = 0;
  BitStreamWriter::putBits(&writer,0x20,0);
  pipStreams.super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pipStreams.super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  pipStreams.super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  __x = (this->m_streamInfo).super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>.
        _M_impl.super__Vector_impl_data._M_start;
  pMVar3 = (this->m_streamInfo).super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_b4 = 0;
  for (; __x != pMVar3; __x = __x + 1) {
    bVar5 = isVideoStreamType((__x->super_M2TSStreamInfo).stream_coding_type);
    if (bVar5) {
      if ((__x->super_M2TSStreamInfo).isSecondary == true) {
        std::vector<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>::push_back(&pipStreams,__x);
      }
      else {
        local_b8 = (__x->super_M2TSStreamInfo).width;
        local_b4 = (__x->super_M2TSStreamInfo).height;
      }
    }
  }
  uVar9 = ((long)pipStreams.super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
          (long)pipStreams.super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>.
                _M_impl.super__Vector_impl_data._M_start) / 0x70;
  uVar6 = (uint)(((long)(pmtIndexList->
                        super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(pmtIndexList->
                       super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start) / 0x30);
  BitStreamWriter::putBits(&writer,0x10,(int)uVar9 * uVar6);
  blockDataAddressPos.super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  blockDataAddressPos.super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  blockDataAddressPos.super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (uVar14 = 0; uVar14 != uVar6; uVar14 = uVar14 + 1) {
    lVar12 = 0x68;
    for (uVar15 = 0; (uVar9 & 0xffffffff) != uVar15; uVar15 = uVar15 + 1) {
      uVar10 = *(uint *)(((pipStreams.
                           super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>.
                           _M_impl.super__Vector_impl_data._M_start)->super_M2TSStreamInfo).
                         language_code + lVar12 + -0x20);
      BitStreamWriter::putBits(&writer,0x10,uVar14);
      BitStreamWriter::putBits(&writer,8,(uint)uVar15);
      BitStreamWriter::putBits(&writer,8,0);
      BitStreamWriter::putBits(&writer,4,~uVar10 >> 0x1f);
      BitStreamWriter::putBit(&writer,1);
      BitStreamWriter::putBit(&writer,1);
      BitStreamWriter::putBits(&writer,10,0);
      BitStreamWriter::putBits(&writer,8,0);
      if ((int)uVar10 < 0) {
        uVar10 = 0;
      }
      BitStreamWriter::putBits(&writer,8,uVar10);
      BitStreamWriter::putBits(&writer,0x10,0);
      local_50 = (uint *)((long)((int)(((int)writer.super_BitStream.m_buffer -
                                       (int)writer.super_BitStream.m_initBuffer) * 8 +
                                      writer.m_bitWrited) / 8) +
                         (long)writer.super_BitStream.m_initBuffer);
      std::vector<unsigned_int*,std::allocator<unsigned_int*>>::emplace_back<unsigned_int*>
                ((vector<unsigned_int*,std::allocator<unsigned_int*>> *)&blockDataAddressPos,
                 &local_50);
      BitStreamWriter::putBits(&writer,0x20,0);
      lVar12 = lVar12 + 0x70;
    }
  }
  while ((writer.m_bitWrited +
          ((int)writer.super_BitStream.m_buffer - (int)writer.super_BitStream.m_initBuffer) * 8 &
         0xf) != 0) {
    BitStreamWriter::putBit(&writer,0);
  }
  uVar9 = 0;
  puVar11 = writer.super_BitStream.m_buffer;
  puVar13 = writer.super_BitStream.m_initBuffer;
  uVar6 = writer.m_bitWrited;
  do {
    if ((ulong)(((long)(pmtIndexList->
                       super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                (long)(pmtIndexList->
                      super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start) / 0x30) <= uVar9) {
      BitStreamWriter::flushBits(&writer);
      uVar7 = my_ntohl((int)(((int)writer.super_BitStream.m_buffer -
                             (int)writer.super_BitStream.m_initBuffer) * 8 + writer.m_bitWrited) / 8
                       - 4);
      *(uint32_t *)buffer = uVar7;
      iVar8 = ((int)writer.super_BitStream.m_buffer - (int)writer.super_BitStream.m_initBuffer) * 8
              + writer.m_bitWrited;
      std::_Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>::~_Vector_base
                (&blockDataAddressPos.
                  super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>);
      std::vector<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>::~vector(&pipStreams);
      return iVar8 / 8;
    }
    for (uVar15 = 0;
        uVar15 < (ulong)(((long)pipStreams.
                                super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)pipStreams.
                               super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>.
                               _M_impl.super__Vector_impl_data._M_start) / 0x70);
        uVar15 = uVar15 + 1) {
      uVar14 = pipStreams.super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar15].pipParams.scaleIndex;
      PVar1 = pipStreams.super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>._M_impl
              .super__Vector_impl_data._M_start[uVar15].pipParams.corner;
      uVar10 = pipStreams.super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar15].pipParams.hOffset;
      uVar2 = pipStreams.super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>._M_impl
              .super__Vector_impl_data._M_start[uVar15].pipParams.vOffset;
      uVar7 = my_ntohl((int)(uVar6 + ((int)puVar11 - (int)puVar13) * 8) / 8);
      *blockDataAddressPos.super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>.
       _M_impl.super__Vector_impl_data._M_start
       [(((long)pipStreams.super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>.
                _M_impl.super__Vector_impl_data._M_finish -
         (long)pipStreams.super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>.
               _M_impl.super__Vector_impl_data._M_start) / 0x70) * uVar9 + uVar15] = uVar7;
      BitStreamWriter::putBits(&writer,0x10,1);
      if (uVar9 == 0) {
LAB_001e8287:
        BitStreamWriter::putBits(&writer,0x20,this->IN_time);
      }
      else {
        pmVar4 = (pmtIndexList->
                 super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if (*(size_t *)((long)&pmVar4[uVar9 - 1]._M_t._M_impl.super__Rb_tree_header + 0x20) == 0)
        goto LAB_001e8287;
        BitStreamWriter::putBits
                  (&writer,0x20,
                   (uint)(*(ulong *)(*(_Base_ptr *)
                                      ((long)&pmVar4[uVar9]._M_t._M_impl.super__Rb_tree_header +
                                      0x10) + 1) >> 1));
      }
      uVar6 = 0;
      value = 0;
      if (uVar14 != 5) {
        fVar16 = 1.0;
        if (uVar14 - 2 < 3) {
          fVar16 = *(float *)(&DAT_0020c2b0 + (ulong)(uVar14 - 2) * 4);
        }
        if (PVar1 - TopRight < 2) {
          uVar10 = local_b8 -
                   (uVar10 + (int)((float)pipStreams.
                                          super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>
                                          ._M_impl.super__Vector_impl_data._M_start[uVar15].
                                          super_M2TSStreamInfo.width * fVar16));
        }
        uVar6 = uVar10;
        value = local_b4 -
                ((int)(fVar16 * (float)pipStreams.
                                       super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar15].
                                       super_M2TSStreamInfo.height) + uVar2);
        if ((PVar1 & ~TopRight) != BottomRight) {
          value = uVar2;
        }
      }
      BitStreamWriter::putBits(&writer,0xc,uVar6);
      BitStreamWriter::putBits(&writer,0xc,value);
      BitStreamWriter::putBits(&writer,4,uVar14);
      BitStreamWriter::putBits(&writer,4,0);
      while ((writer.m_bitWrited +
              ((int)writer.super_BitStream.m_buffer - (int)writer.super_BitStream.m_initBuffer) * 8
             & 0xf) != 0) {
        BitStreamWriter::putBit(&writer,0);
      }
      puVar11 = writer.super_BitStream.m_buffer;
      puVar13 = writer.super_BitStream.m_initBuffer;
      uVar6 = writer.m_bitWrited;
    }
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

int MPLSParser::composePip_metadata(uint8_t* buffer, const int bufferSize,
                                    const std::vector<PMTIndex>& pmtIndexList) const
{
    // The ID1 value and the ID2 value of the ExtensionData() shall be set to 0x0001 and 0x0001
    BitStreamWriter writer{};
    writer.setBuffer(buffer, buffer + bufferSize);
    const auto lengthPos = reinterpret_cast<uint32_t*>(buffer);
    writer.putBits(32, 0);  // length

    vector<MPLSStreamInfo> pipStreams;
    unsigned mainVSize = 0, mainHSize = 0;
    for (auto& si : m_streamInfo)
    {
        const StreamType stream_coding_type = si.stream_coding_type;
        if (isVideoStreamType(stream_coding_type))
        {
            if (si.isSecondary)
            {
                pipStreams.push_back(si);
            }
            else
            {
                mainHSize = si.width;
                mainVSize = si.height;
            }
        }
    }

    const auto pipStreamsSize = static_cast<unsigned>(pipStreams.size());
    const auto pmtIndexListSize = static_cast<unsigned>(pmtIndexList.size());

    writer.putBits(16, pipStreamsSize * pmtIndexListSize);
    vector<uint32_t*> blockDataAddressPos;
    for (unsigned i = 0; i < pmtIndexListSize; ++i)
    {
        for (unsigned k = 0; k < pipStreamsSize; k++)
        {
            const PIPParams pipParams = pipStreams[k].pipParams;
            // metadata_block_header[k]() {
            writer.putBits(16, i);  // ref_to_PlayItem_id
            writer.putBits(8, k);   // ref_to_secondary_video_stream_id
            writer.putBits(8, 0);   // reserved_for_future_use
            // pip_timeline_type == 1. Synchronous type of Picture-in-Picture
            writer.putBits(4, pipParams.lumma >= 0 ? 1 : 0);
            writer.putBit(1);       // is_luma_key = 0
            writer.putBit(1);       // trick_playing_flag. keep PIP windows when tricking
            writer.putBits(10, 0);  // reserved_for_word_align
            writer.putBits(8, 0);   // reserved_for_future_use
            if (pipParams.lumma >= 0)
            {                                        // is_luma_key==1b
                writer.putBits(8, pipParams.lumma);  // transparent Y pixels
            }
            else
            {
                writer.putBits(8, 0);  // reserved_for_future_use
            }
            writer.putBits(16, 0);  // reserved_for_future_use
            blockDataAddressPos.push_back(reinterpret_cast<uint32_t*>(writer.getBuffer() + writer.getBitsCount() / 8));
            writer.putBits(32, 0);  // metadata_block_data_start_address
        }
    }
    while (writer.getBitsCount() % 16 != 0) writer.putBit(0);
    for (size_t i = 0; i < pmtIndexList.size(); ++i)
    {
        for (size_t k = 0; k < pipStreams.size(); ++k)
        {
            PIPParams pipParams = pipStreams[k].pipParams;

            *(blockDataAddressPos[i * pipStreams.size() + k]) = my_htonl(writer.getBitsCount() / 8);

            writer.putBits(16, 1);  // number_of_pip_metadata_entries
            {
                if (i != 0 && !pmtIndexList[i - 1].empty())
                    writer.putBits(32, static_cast<unsigned>(pmtIndexList[i].begin()->first / 2));
                else
                    writer.putBits(32, IN_time);

                unsigned hPos = 0;
                unsigned vPos = 0;

                if (!pipParams.isFullScreen())
                {
                    hPos = pipParams.hOffset;
                    vPos = pipParams.vOffset;

                    const int pipWidth =
                        static_cast<int>(static_cast<float>(pipStreams[k].width) * pipParams.getScaleCoeff());
                    const int pipHeight =
                        static_cast<int>(static_cast<float>(pipStreams[k].height) * pipParams.getScaleCoeff());

                    if (pipParams.corner == PIPParams::PipCorner::TopRight ||
                        pipParams.corner == PIPParams::PipCorner::BottomRight)
                        hPos = mainHSize - pipWidth - pipParams.hOffset;
                    if (pipParams.corner == PIPParams::PipCorner::BottomRight ||
                        pipParams.corner == PIPParams::PipCorner::BottomLeft)
                        vPos = mainVSize - pipHeight - pipParams.vOffset;
                }

                writer.putBits(12, hPos);
                writer.putBits(12, vPos);

                writer.putBits(4, pipParams.scaleIndex);  // pip_scale[i]. 1 == no_scale
                writer.putBits(4, 0);                     // reserved_for_future_use
            }
            while (writer.getBitsCount() % 16 != 0) writer.putBit(0);
        }
    }

    writer.flushBits();
    *lengthPos = my_htonl(writer.getBitsCount() / 8 - 4);
    return writer.getBitsCount() / 8;
}